

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

Result wabt::interp::Match(TableType *expected,TableType *actual,string *out_msg)

{
  _Alloc_hider _Var1;
  Result RVar2;
  Enum EVar3;
  string local_80;
  string local_60;
  string local_40;
  
  if (*(int *)&(expected->super_ExternType).field_0xc ==
      *(int *)&(actual->super_ExternType).field_0xc) {
    RVar2 = Match(&expected->limits,&actual->limits,out_msg);
    EVar3 = (Enum)(RVar2.enum_ == Error);
  }
  else {
    local_80._M_dataplus._M_p = *(pointer *)&(expected->super_ExternType).field_0xc;
    Type::GetName_abi_cxx11_(&local_40,(Type *)&local_80);
    _Var1._M_p = local_40._M_dataplus._M_p;
    local_80._M_dataplus._M_p = *(pointer *)&(actual->super_ExternType).field_0xc;
    Type::GetName_abi_cxx11_(&local_60,(Type *)&local_80);
    StringPrintf_abi_cxx11_
              (&local_80,"type mismatch in imported table, expected %s but got %s.",_Var1._M_p,
               local_60._M_dataplus._M_p);
    std::__cxx11::string::operator=((string *)out_msg,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    EVar3 = Error;
  }
  return (Result)EVar3;
}

Assistant:

Result Match(const TableType& expected,
             const TableType& actual,
             std::string* out_msg) {
  if (expected.element != actual.element) {
    *out_msg = StringPrintf(
        "type mismatch in imported table, expected %s but got %s.",
        GetName(expected.element).c_str(), GetName(actual.element).c_str());
    return Result::Error;
  }

  if (Failed(Match(expected.limits, actual.limits, out_msg))) {
    return Result::Error;
  }

  return Result::Ok;
}